

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

uint nsvg__parseColor(char *str)

{
  char cVar1;
  uint in_EAX;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  char *__s;
  long lVar6;
  undefined8 uStack_28;
  
  do {
    __s = str;
    cVar1 = *__s;
    str = __s + 1;
  } while (cVar1 == ' ');
  uStack_28._0_4_ = in_EAX;
  sVar4 = strlen(__s);
  if (cVar1 != '#' || sVar4 == 0) {
    if ((((cVar1 == 'r' && 3 < sVar4) && (*str == 'g')) && (__s[2] == 'b')) && (__s[3] == '(')) {
      uVar2 = nsvg__parseColorRGB(__s);
      return uVar2;
    }
    lVar6 = 8;
    do {
      iVar3 = strcmp(*(char **)(lVar6 + 0x12a388),__s);
      if (iVar3 == 0) {
        return *(uint *)((long)&nsvg__colors[0].name + lVar6);
      }
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0xa8);
    return 0x808080;
  }
  uStack_28 = (ulong)(uint)uStack_28;
  cVar1 = *str;
  if (cVar1 != '\0') {
    lVar6 = 0;
    do {
      pvVar5 = memchr(" \t\n\v\f\r",(int)cVar1,7);
      if (pvVar5 != (void *)0x0) break;
      cVar1 = __s[lVar6 + 2];
      lVar6 = lVar6 + 1;
    } while (cVar1 != '\0');
    if ((int)lVar6 == 3) {
      __isoc99_sscanf(str,"%x",(long)&uStack_28 + 4);
      uStack_28._4_4_ =
           (uStack_28._4_4_ & 0xf00) << 8 | (uStack_28._4_4_ & 0xf0) << 4 | uStack_28._4_4_ & 0xf;
      uStack_28._4_4_ = uStack_28._4_4_ << 4 | uStack_28._4_4_;
      goto LAB_00115f22;
    }
    if ((int)lVar6 == 6) {
      __isoc99_sscanf(str,"%x",(long)&uStack_28 + 4);
      goto LAB_00115f22;
    }
  }
  uStack_28._4_4_ = 0;
LAB_00115f22:
  return (uStack_28._4_4_ & 0xff) << 0x10 |
         uStack_28._4_4_ & 0xff00 | uStack_28._4_4_ >> 0x10 & 0xff;
}

Assistant:

static unsigned int nsvg__parseColor(const char* str)
{
	size_t len = 0;
	while(*str == ' ') ++str;
	len = strlen(str);
	if (len >= 1 && *str == '#')
		return nsvg__parseColorHex(str);
	else if (len >= 4 && str[0] == 'r' && str[1] == 'g' && str[2] == 'b' && str[3] == '(')
		return nsvg__parseColorRGB(str);
	return nsvg__parseColorName(str);
}